

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937-64.c
# Opt level: O2

void init_by_array64(unsigned_long_long *init_key,unsigned_long_long key_length)

{
  ulong uVar1;
  ulong uVar2;
  unsigned_long_long uVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  
  init_genrand64(0x12bd6aa);
  uVar3 = 0x138;
  if (0x138 < key_length) {
    uVar3 = key_length;
  }
  uVar2 = 1;
  uVar5 = 0;
  while (bVar6 = uVar3 != 0, uVar3 = uVar3 - 1, bVar6) {
    mt[uVar2] = init_key[uVar5] + uVar5 +
                (((ulong)(&obme::_OBME_MASK)[uVar2] >> 0x3e ^ (&obme::_OBME_MASK)[uVar2]) *
                 0x369dea0f31a53f85 ^ mt[uVar2]);
    uVar1 = 1;
    if (uVar2 < 0x137) {
      uVar1 = uVar2 + 1;
    }
    uVar5 = uVar5 + 1;
    uVar2 = uVar1;
    if (key_length <= uVar5) {
      uVar5 = 0;
    }
  }
  for (lVar4 = -0x137; lVar4 != 0; lVar4 = lVar4 + 1) {
    mt[uVar2] = (((ulong)(&obme::_OBME_MASK)[uVar2] >> 0x3e ^ (&obme::_OBME_MASK)[uVar2]) *
                 0x27bb2ee687b0b0fd ^ mt[uVar2]) - uVar2;
    uVar5 = 1;
    if (uVar2 < 0x137) {
      uVar5 = uVar2 + 1;
    }
    uVar2 = uVar5;
  }
  mt[0] = 0x8000000000000000;
  return;
}

Assistant:

void init_by_array64(unsigned long long init_key[],
		     unsigned long long key_length)
{
    unsigned long long i, j, k;
    init_genrand64(19650218ULL);
    i=1; j=0;
    k = (NN>key_length ? NN : key_length);
    for (; k; k--) {
        mt[i] = (mt[i] ^ ((mt[i-1] ^ (mt[i-1] >> 62)) * 3935559000370003845ULL))
          + init_key[j] + j; /* non linear */
        i++; j++;
        if (i>=NN) { mt[0] = mt[NN-1]; i=1; }
        if (j>=key_length) j=0;
    }
    for (k=NN-1; k; k--) {
        mt[i] = (mt[i] ^ ((mt[i-1] ^ (mt[i-1] >> 62)) * 2862933555777941757ULL))
          - i; /* non linear */
        i++;
        if (i>=NN) { mt[0] = mt[NN-1]; i=1; }
    }

    mt[0] = 1ULL << 63; /* MSB is 1; assuring non-zero initial array */ 
}